

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateAbstractMethods
          (ImmutableServiceGenerator *this,Printer *printer)

{
  ServiceDescriptor *this_00;
  MethodDescriptor *method;
  int index;
  string_view text;
  Options local_80;
  
  for (index = 0; this_00 = (this->super_ServiceGenerator).descriptor_,
      index < this_00->method_count_; index = index + 1) {
    method = ServiceDescriptor::method(this_00,index);
    Options::Options(&local_80,&this->context_->options_);
    WriteMethodDocComment(printer,method,&local_80);
    Options::~Options(&local_80);
    GenerateMethodSignature(this,printer,method,IS_ABSTRACT);
    text._M_str = ";\n\n";
    text._M_len = 3;
    io::Printer::Print<>(printer,text);
  }
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateAbstractMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    WriteMethodDocComment(printer, method, context_->options());
    GenerateMethodSignature(printer, method, IS_ABSTRACT);
    printer->Print(";\n\n");
  }
}